

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
obx::internal::idVectorOrThrow
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          OBX_id_array *cIds)

{
  obx_id *__src;
  obx_err err;
  size_type sVar1;
  unsigned_long *__dest;
  OBX_id_array *cIds_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  if (cIds == (OBX_id_array *)0x0) {
    err = obx_last_error_code();
    throwLastError(err,(char *)0x0);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  if (cIds->count != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,cIds->count);
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(__return_storage_ptr__)
    ;
    if (sVar1 != cIds->count) {
      throwIllegalStateException("State condition failed: ","result.size() == cIds->count");
    }
    __dest = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       (__return_storage_ptr__);
    __src = cIds->ids;
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(__return_storage_ptr__)
    ;
    memcpy(__dest,__src,sVar1 << 3);
  }
  obx_id_array_free(cIds);
  return __return_storage_ptr__;
}

Assistant:

std::vector<obx_id> idVectorOrThrow(OBX_id_array* cIds) {
    if (cIds == nullptr) internal::throwLastError();

    try {
        std::vector<obx_id> result;
        if (cIds->count > 0) {
            result.resize(cIds->count);
            OBX_VERIFY_STATE(result.size() == cIds->count);
            memcpy(result.data(), cIds->ids, result.size() * sizeof(result[0]));
        }
        obx_id_array_free(cIds);
        return result;
    } catch (...) {
        obx_id_array_free(cIds);
        throw;
    }
}